

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O1

void __thiscall
VertexAttrib64Bit::LimitTest::setAttributes_b
          (LimitTest *this,attributeConfiguration *configuration,GLint n_type,GLuint vertex,
          vector<double,_std::allocator<double>_> *out_buffer_data)

{
  int iVar1;
  uint uVar2;
  pointer pdVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  
  iVar1 = configuration->m_n_attributes_per_group;
  if (n_type < 1) {
    iVar5 = 0;
  }
  else {
    uVar9 = 0;
    iVar5 = 0;
    do {
      iVar5 = iVar5 + configuration->m_n_elements[uVar9] * iVar1;
      uVar9 = uVar9 + 1;
    } while ((uint)n_type != uVar9);
  }
  if (0 < iVar1) {
    uVar2 = configuration->m_n_elements[n_type];
    uVar6 = iVar5 + configuration->m_vertex_length * vertex;
    uVar4 = vertex * uVar2 + n_type * iVar1;
    pdVar3 = (out_buffer_data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar5 = 0;
    do {
      uVar9 = (ulong)uVar2;
      uVar7 = uVar4;
      uVar8 = uVar6;
      if (0 < (int)uVar2) {
        do {
          pdVar3[uVar8] = (double)uVar7;
          uVar8 = uVar8 + 1;
          uVar7 = uVar7 + 1;
          uVar9 = uVar9 - 1;
        } while (uVar9 != 0);
      }
      iVar5 = iVar5 + 1;
      uVar6 = uVar6 + uVar2;
      uVar4 = uVar4 + 1;
    } while (iVar5 != iVar1);
  }
  return;
}

Assistant:

void LimitTest::setAttributes_b(const attributeConfiguration& configuration, GLint n_type, GLuint vertex,
								std::vector<GLdouble>& out_buffer_data) const
{
	const GLint n_attributes	= configuration.m_n_attributes_per_group;
	const GLint attribute_index = n_attributes * n_type;
	const GLint n_elements		= configuration.m_n_elements[n_type];
	GLuint		vertex_offset   = vertex * configuration.m_vertex_length;

	const GLint group_offset = calculateAttributeGroupOffset(configuration, n_type) + vertex_offset;

	/* Dvec3 attribute components should be assigned the following
	 vector values:
	 (n_attribute + gl_VertexID * 3 + 0,
	 n_attribute + gl_VertexID * 3 + 1,
	 n_attribute + gl_VertexID * 3 + 2).

	 Dvec4 attribute components should be assigned the following
	 vector values:
	 (n_attribute + gl_VertexID * 4 + 0,
	 n_attribute + gl_VertexID * 4 + 1,
	 n_attribute + gl_VertexID * 4 + 2,
	 n_attribute + gl_VertexID * 4 + 3).*/

	for (GLint attribute = 0; attribute < n_attributes; ++attribute)
	{
		const GLuint attribute_offset = n_elements * attribute + group_offset;

		for (GLint i = 0; i < n_elements; ++i)
		{
			out_buffer_data[attribute_offset + i] = attribute + attribute_index + vertex * n_elements + i;
		}
	}
}